

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

type fmt::v5::
     format_to<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char[3],int>
               (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> out,
               char (*format_str) [3],int *args)

{
  type args_00;
  type tVar1;
  basic_string_view<char> *in_RDX;
  char (*in_RSI) [3];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>_2
  in_RDI;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_int>
  as;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_int>
  *in_stack_ffffffffffffff98;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
  *in_stack_ffffffffffffffa0;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> in_stack_fffffffffffffff8;
  
  internal::check_format_string<int,char[3]>(in_RSI);
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_int>
  ::format_arg_store((format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_int>
                      *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
  to_string_view<char>((char *)0x19e050);
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
  ::basic_format_args<int>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  args_00.field_1.values_ = in_RDI.values_;
  args_00.types_ = (unsigned_long_long)in_RSI;
  tVar1 = vformat_to<fmt::v5::basic_string_view<char>,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (in_stack_fffffffffffffff8,in_RDX,args_00);
  return (type)tVar1.container;
}

Assistant:

format_to(OutputIt out, const S &format_str, const Args &... args) {
  internal::check_format_string<Args...>(format_str);
  typedef typename format_context_t<OutputIt, FMT_CHAR(S)>::type context;
  format_arg_store<context, Args...> as{args...};
  return vformat_to(out, to_string_view(format_str),
                    basic_format_args<context>(as));
}